

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day03.cpp
# Opt level: O2

void day03(input_t input)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint8_t uVar8;
  unsigned_short uVar9;
  pointer __a;
  pointer pcVar10;
  pointer pcVar11;
  pointer pcVar12;
  array<unsigned_short,_5UL> *paVar13;
  long lVar14;
  pointer pcVar15;
  size_t __n;
  array<unsigned_short,_5UL> *extraout_RDX;
  array<unsigned_short,_5UL> *paVar16;
  size_t extraout_RDX_00;
  size_t __n_00;
  pointer pcVar17;
  char cVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  __normal_iterator<(anonymous_namespace)::claim_t_*,_std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>_>
  __i;
  char *pcVar23;
  bool bVar24;
  ulong local_1a0;
  vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_> local_198;
  array<unsigned_short,_5UL> arr;
  value_type_conflict2 local_168;
  uint64_t uStack_160;
  undefined8 local_158;
  pointer local_148;
  array<unsigned_long,_17UL> collide;
  array<unsigned_long,_17UL> row;
  
  lVar21 = input.len;
  pcVar23 = input.s;
  local_198.
  super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __a = (pointer)operator_new(36000);
  iVar19 = 0;
  std::_Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
  ::_M_deallocate((_Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                   *)0x0,(pointer)0x0,__n);
  pcVar15 = __a + 0x5dc;
  uVar9 = 0;
  paVar16 = (array<unsigned_short,_5UL> *)0x0;
  local_198.
  super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
  ._M_impl.super__Vector_impl_data._M_start = __a;
  do {
    pcVar17 = local_198.
              super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
              ._M_impl.super__Vector_impl_data._M_start;
    paVar13 = (array<unsigned_short,_5UL> *)0x1;
    bVar24 = lVar21 == 0;
    lVar21 = lVar21 + -1;
    if (bVar24) {
      local_198.
      super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
      ._M_impl.super__Vector_impl_data._M_finish = __a;
      local_198.
      super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar15;
      if (local_198.
          super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
          ._M_impl.super__Vector_impl_data._M_start != __a) {
        lVar21 = (long)__a -
                 (long)local_198.
                       super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_198.
                   super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                   ._M_impl.super__Vector_impl_data._M_start,__a,
                   (int)LZCOUNT(lVar21 / 0x18) * 2 ^ 0x7e);
        if (lVar21 < 0x181) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pcVar17,__a);
        }
        else {
          pcVar15 = pcVar17 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pcVar17,pcVar15);
          for (; pcVar15 != __a; pcVar15 = pcVar15 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::claim_t*,std::vector<(anonymous_namespace)::claim_t,std::allocator<(anonymous_namespace)::claim_t>>>,__gnu_cxx::__ops::_Val_less_iter>
                      (pcVar15);
          }
        }
      }
      uVar22 = 0;
      local_1a0 = 0;
      while (pcVar17 != __a) {
        local_168 = 0;
        std::array<unsigned_long,_17UL>::fill(&row,&local_168);
        local_168 = 0;
        std::array<unsigned_long,_17UL>::fill(&collide,&local_168);
        uVar2 = __a[-1].y;
        for (pcVar15 = __a; (pcVar15 != pcVar17 && (pcVar15[-1].y == uVar2)); pcVar15 = pcVar15 + -1
            ) {
          uVar4 = (ulong)pcVar15[-1].idx;
          uVar20 = row._M_elems[uVar4];
          uVar3 = row._M_elems[uVar4 + 1];
          collide._M_elems[uVar4] = collide._M_elems[uVar4] | pcVar15[-1].mask0 & uVar20;
          row._M_elems[uVar4] = uVar20 | pcVar15[-1].mask0;
          collide._M_elems[uVar4 + 1] = collide._M_elems[uVar4 + 1] | pcVar15[-1].mask1 & uVar3;
          row._M_elems[uVar4 + 1] = uVar3 | pcVar15[-1].mask1;
        }
        pcVar15 = __a;
        while ((pcVar10 = pcVar15, pcVar10 != pcVar17 && (pcVar10[-1].y == uVar2))) {
          cVar18 = pcVar10[-1].part2;
          if (((bool)cVar18 == true) &&
             (((collide._M_elems[pcVar10[-1].idx] & pcVar10[-1].mask0) != 0 ||
              ((collide._M_elems[(ulong)pcVar10[-1].idx + 1] & pcVar10[-1].mask1) != 0)))) {
            cVar18 = '\0';
            pcVar10[-1].part2 = false;
          }
          pcVar10[-1].y = uVar2 + 1;
          puVar1 = &pcVar10[-1].h;
          *puVar1 = *puVar1 - 1;
          pcVar15 = pcVar10 + -1;
          if (*puVar1 == 0) {
            if (cVar18 != '\0') {
              local_1a0 = (ulong)pcVar10[-1].id;
            }
            local_158._0_2_ = pcVar10[-1].id;
            local_158._2_2_ = pcVar10[-1].y;
            local_158._4_2_ = pcVar10[-1].h;
            local_158._6_1_ = pcVar10[-1].idx;
            local_158._7_1_ = pcVar10[-1].part2;
            local_168 = pcVar15->mask0;
            uStack_160 = pcVar10[-1].mask1;
            uVar6 = __a[-1].y;
            uVar7 = __a[-1].h;
            uVar8 = __a[-1].idx;
            bVar24 = __a[-1].part2;
            pcVar10[-1].id = __a[-1].id;
            pcVar10[-1].y = uVar6;
            pcVar10[-1].h = uVar7;
            pcVar10[-1].idx = uVar8;
            pcVar10[-1].part2 = bVar24;
            uVar5 = __a[-1].mask1;
            pcVar15->mask0 = __a[-1].mask0;
            pcVar10[-1].mask1 = uVar5;
            __a[-1].id = (undefined2)local_158;
            __a[-1].y = local_158._2_2_;
            __a[-1].h = local_158._4_2_;
            __a[-1].idx = local_158._6_1_;
            __a[-1].part2 = (bool)local_158._7_1_;
            __a[-1].mask0 = local_168;
            __a[-1].mask1 = uStack_160;
            __a = __a + -1;
          }
        }
        for (lVar21 = 0;
            local_198.
            super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
            ._M_impl.super__Vector_impl_data._M_finish = __a, lVar21 != 0x88; lVar21 = lVar21 + 8) {
          uVar22 = uVar22 + (int)POPCOUNT(*(undefined8 *)((long)collide._M_elems + lVar21));
        }
      }
      printf("Day 03 Part 1: %d\nDay 03 Part 2: %d\n",(ulong)uVar22,local_1a0);
      std::vector<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>::
      ~vector(&local_198);
      return;
    }
    pcVar17 = __a;
    if ((byte)(*pcVar23 - 0x30U) < 10) {
      uVar9 = uVar9 * 10 + (ushort)(byte)(*pcVar23 - 0x30U);
    }
    else {
      paVar13 = (array<unsigned_short,_5UL> *)0x0;
      if ((int)paVar16 != 0) {
        lVar14 = (long)iVar19;
        iVar19 = iVar19 + 1;
        arr._M_elems[lVar14] = uVar9;
        if (iVar19 == 5) {
          if (__a == pcVar15) {
            if ((long)__a -
                (long)local_198.
                      super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
              local_198.
              super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
              ._M_impl.super__Vector_impl_data._M_finish = __a;
              local_198.
              super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar15;
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            pcVar10 = (pointer)(((long)__a -
                                (long)local_198.
                                      super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            local_148 = local_198.
                        super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pcVar15 = pcVar10;
            if (__a == local_198.
                       super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
              pcVar15 = (pointer)0x1;
            }
            uVar20 = (long)&pcVar10->mask0 + (long)&pcVar15->mask0;
            if (0x555555555555554 < uVar20) {
              uVar20 = 0x555555555555555;
            }
            paVar16 = (array<unsigned_short,_5UL> *)((long)&pcVar10->mask0 + (long)&pcVar15->mask0);
            if (CARRY8((ulong)pcVar15,(ulong)pcVar10)) {
              uVar20 = 0x555555555555555;
            }
            if (uVar20 == 0) {
              pcVar11 = (pointer)0x0;
            }
            else {
              pcVar11 = (pointer)operator_new(uVar20 * 0x18);
              paVar16 = extraout_RDX;
            }
            std::allocator_traits<std::allocator<(anonymous_namespace)::claim_t>>::
            construct<(anonymous_namespace)::claim_t,std::array<unsigned_short,5ul>&>
                      ((allocator_type *)(pcVar11 + (long)pcVar10),(claim_t *)&arr,paVar16);
            __n_00 = extraout_RDX_00;
            pcVar15 = pcVar11;
            for (pcVar12 = local_148; pcVar17 = pcVar15 + 1, pcVar12 != __a; pcVar12 = pcVar12 + 1)
            {
              __n_00._0_2_ = pcVar12->id;
              __n_00._2_2_ = pcVar12->y;
              __n_00._4_2_ = pcVar12->h;
              __n_00._6_1_ = pcVar12->idx;
              __n_00._7_1_ = pcVar12->part2;
              pcVar15->id = (undefined2)__n_00;
              pcVar15->y = __n_00._2_2_;
              pcVar15->h = __n_00._4_2_;
              pcVar15->idx = __n_00._6_1_;
              pcVar15->part2 = (bool)__n_00._7_1_;
              uVar5 = pcVar12->mask1;
              pcVar15->mask0 = pcVar12->mask0;
              pcVar15->mask1 = uVar5;
              pcVar15 = pcVar17;
            }
            std::
            _Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
            ::_M_deallocate((_Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
                             *)local_148,pcVar10,__n_00);
            paVar13 = (array<unsigned_short,_5UL> *)0x0;
            uVar9 = 0;
            pcVar15 = pcVar11 + uVar20;
            iVar19 = 0;
            local_198.
            super__Vector_base<(anonymous_namespace)::claim_t,_std::allocator<(anonymous_namespace)::claim_t>_>
            ._M_impl.super__Vector_impl_data._M_start = pcVar11;
            goto LAB_00104620;
          }
          std::allocator_traits<std::allocator<(anonymous_namespace)::claim_t>>::
          construct<(anonymous_namespace)::claim_t,std::array<unsigned_short,5ul>&>
                    ((allocator_type *)__a,(claim_t *)&arr,paVar16);
          pcVar17 = __a + 1;
          iVar19 = 0;
        }
        paVar13 = (array<unsigned_short,_5UL> *)0x0;
        uVar9 = 0;
      }
    }
LAB_00104620:
    pcVar23 = pcVar23 + 1;
    paVar16 = paVar13;
    __a = pcVar17;
  } while( true );
}

Assistant:

void day03(input_t input) {
	std::vector<claim_t> v;
	v.reserve(1500);

	std::array<uint16_t, 5> arr;
	for (int n = 0, have = 0, i = 0; input.len--; input.s++) {
		uint8_t c = *input.s - '0';
		if (c < 10) {
			n = 10 * n + c;
			have = 1;
		} else if (have) {
			arr[i++] = n;
			if (i == 5) {
				v.emplace_back(arr);
				i = 0;
			}
			n = have = 0;
		}
	}

	// Sort by starting y-index
	std::sort(v.begin(), v.end());

	int part1 = 0, part2 = 0;

	/* Sweep vertically down the fabric, one row at a time,
	 * checking for collisions between claims.
	 */
	std::array<uint64_t, 17> row, collide;
	while (!v.empty()) {
		row.fill(0);
		collide.fill(0);

		auto y = v.back().y;
		for (auto vi = v.rbegin(); vi != v.rend() && vi->y == y; vi++) {
			collide[vi->idx + 0] |= row[vi->idx + 0] & vi->mask0;
			row[vi->idx + 0] |= vi->mask0;
			collide[vi->idx + 1] |= row[vi->idx + 1] & vi->mask1;
			row[vi->idx + 1] |= vi->mask1;
		}

		for (auto vi = v.rbegin(); vi != v.rend() && vi->y == y; vi++) {
			if (vi->part2) {
				if ((collide[vi->idx + 0] & vi->mask0) ||
				    (collide[vi->idx + 1] & vi->mask1))
				{
					vi->part2 = false;
				}
			}

			vi->y++;
			if (--vi->h == 0) {
				/* Reached the bottom of this claim; check for
				 * part2 solution and remove the claim
				 */
				if (vi->part2) {
					part2 = vi->id;
				}
				std::swap(*vi, v.back());
				v.pop_back();
			}
		}

		// Just tally up the 1-bits for part1
		for (auto c : collide) {
			part1 += _mm_popcnt_u64(c);
		}
	}

	printf("Day 03 Part 1: %d\nDay 03 Part 2: %d\n", part1, part2);
}